

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partitioned_column_data.hpp
# Opt level: O3

void __thiscall
duckdb::PartitionedColumnDataAppendState::PartitionedColumnDataAppendState
          (PartitionedColumnDataAppendState *this)

{
  LogicalType local_30;
  
  LogicalType::LogicalType(&local_30,UBIGINT);
  Vector::Vector(&this->partition_indices,&local_30,0x800);
  LogicalType::~LogicalType(&local_30);
  (this->partition_sel).sel_vector = (sel_t *)0x0;
  (this->partition_sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->partition_sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->partition_entries)._M_h._M_buckets = &(this->partition_entries)._M_h._M_single_bucket;
  (this->partition_entries)._M_h._M_bucket_count = 1;
  (this->partition_entries)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->partition_entries)._M_h._M_element_count = 0;
  (this->partition_entries)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->partition_entries)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->partition_entries)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  fixed_size_map_t<duckdb::list_entry_t>::fixed_size_map_t(&this->fixed_partition_entries,0);
  DataChunk::DataChunk(&this->slice_chunk);
  (this->partition_append_states).
  super_vector<duckdb::unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->partition_append_states).
  super_vector<duckdb::unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->partition_buffers).
  super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->partition_append_states).
  super_vector<duckdb::unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataAppendState,_std::default_delete<duckdb::ColumnDataAppendState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->partition_buffers).
  super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->partition_buffers).
  super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

PartitionedColumnDataAppendState() : partition_indices(LogicalType::UBIGINT) {
	}